

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>
               (unsigned_long_long num1,_func_int_char_ptr_ptr_long_ptr *read_f,bool is_ok)

{
  code cVar1;
  byte bVar2;
  mp_type mVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  code *pcVar13;
  char (*pacVar14) [16];
  char (*pacVar15) [16];
  double dVar16;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  char *pcVar17;
  code *pcVar18;
  undefined8 *puVar19;
  ulong uVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  ulong uVar24;
  char *pcVar25;
  code *pcVar26;
  undefined8 *puVar27;
  code *unaff_R13;
  byte *__maxlen;
  undefined1 *__maxlen_00;
  bool bVar28;
  undefined1 auVar29 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_e20;
  undefined1 *puStack_e18;
  char acStack_e10 [256];
  undefined1 uStack_d10;
  undefined8 uStack_d0f;
  undefined1 auStack_d07 [247];
  undefined8 *puStack_c10;
  byte *pbStack_c08;
  code *pcStack_c00;
  double dStack_bf0;
  undefined8 *puStack_be8;
  char (*pacStack_be0) [16];
  char acStack_bd8 [256];
  byte bStack_ad8;
  undefined1 auStack_ad7 [2];
  undefined1 auStack_ad5 [6];
  undefined8 uStack_acf;
  undefined8 uStack_ac7;
  long lStack_9d0;
  ulong uStack_9c8;
  char *pcStack_9c0;
  char *pcStack_9b8;
  char *pcStack_9b0;
  code *pcStack_9a8;
  char (*pacStack_9a0) [16];
  char *pcStack_998;
  float fStack_990;
  undefined4 uStack_98c;
  double dStack_988;
  double dStack_980;
  char (*pacStack_978) [16];
  char acStack_970 [256];
  byte bStack_870;
  undefined8 uStack_86f;
  char acStack_867 [255];
  long lStack_768;
  ulong uStack_760;
  char *pcStack_758;
  char *pcStack_750;
  char *pcStack_748;
  code *pcStack_740;
  char (*pacStack_738) [16];
  char *pcStack_730;
  float fStack_728;
  undefined4 uStack_724;
  double dStack_720;
  double dStack_718;
  code *pcStack_710;
  byte bStack_708;
  undefined8 uStack_707;
  char acStack_6ff [247];
  char acStack_608 [256];
  undefined1 auStack_508 [8];
  undefined8 *puStack_500;
  ulong uStack_4f8;
  undefined8 *puStack_4f0;
  long lStack_4e8;
  undefined1 *puStack_4e0;
  code *pcStack_4d8;
  code *pcStack_4d0;
  float fStack_4c4;
  double dStack_4c0;
  double dStack_4b8;
  undefined8 *puStack_4b0;
  code *pcStack_4a8;
  byte bStack_4a0;
  undefined1 auStack_49f [2];
  undefined1 auStack_49d [6];
  undefined8 auStack_497 [30];
  char acStack_3a0 [256];
  undefined1 auStack_2a0 [8];
  code *pcStack_298;
  code *pcStack_290;
  code *pcStack_288;
  char *pcStack_280;
  char *pcStack_278;
  code *pcStack_270;
  float local_260;
  undefined4 local_25c;
  ulong local_258;
  code *local_250;
  double local_248;
  double dStack_240;
  char local_238;
  undefined1 local_237 [8];
  undefined1 local_22f [247];
  char local_138 [256];
  undefined1 local_38 [8];
  
  local_25c = SUB84(read_f,0);
  builtin_strncpy(local_138,"typed read of ",0xf);
  pcStack_270 = (code *)0x130920;
  iVar4 = snprintf(local_138 + 0xe,0xf2,"%llu",num1);
  pcVar22 = local_138 + (long)iVar4 + 0xe;
  pcStack_270 = (code *)0x130944;
  iVar4 = snprintf(pcVar22,(size_t)(local_38 + -(long)pcVar22)," into ");
  pcStack_270 = (code *)0x130963;
  snprintf(pcVar22 + iVar4,(size_t)(local_38 + -(long)(pcVar22 + iVar4)),"int%zu_t",0x40);
  pcStack_270 = (code *)0x130972;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x13098b;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x13099b;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x1309a8;
  fputc(10,_stdout);
  pcStack_270 = (code *)0x1309b5;
  pcVar22 = (char *)num1;
  uVar5 = test_encode_uint_all_sizes((char (*) [16])&local_238,num1);
  if (-1 < (long)num1) {
    pcVar22 = (char *)0x7fffffffffffffff;
    pcStack_270 = (code *)0x1309e0;
    iVar4 = test_encode_int_all_sizes
                      ((char (*) [16])(&local_238 + (long)(int)uVar5 * 0x10),0x7fffffffffffffff);
    uVar5 = uVar5 + iVar4;
  }
  if (0 < (int)uVar5) {
    local_260 = (float)num1;
    auVar29._8_4_ = (int)(num1 >> 0x20);
    auVar29._0_8_ = num1;
    auVar29._12_4_ = 0x45300000;
    dStack_240 = auVar29._8_8_ - 1.9342813113834067e+25;
    local_248 = dStack_240 + ((double)CONCAT44(0x43300000,(int)num1) - 4503599627370496.0);
    uVar20 = (ulong)uVar5;
    pcVar26 = (code *)(local_237 + 1);
    pcVar18 = (code *)0x0;
    local_258 = num1;
    do {
      lVar8 = (long)pcVar18 * 0x10;
      cVar1 = pcVar26[-2];
      uVar9 = (ulong)(byte)cVar1;
      uVar24 = (ulong)(char)cVar1;
      mVar3 = mp_type_hint[uVar9];
      if (mVar3 == MP_UINT) {
        switch(cVar1) {
        case (code)0xcc:
          uVar9 = (ulong)(byte)pcVar26[-1];
          pcVar22 = (char *)pcVar26;
          break;
        case (code)0xcd:
          uVar9 = (ulong)(ushort)(*(ushort *)(pcVar26 + -1) << 8 | *(ushort *)(pcVar26 + -1) >> 8);
          pcVar22 = local_237 + lVar8 + 2;
          break;
        case (code)0xce:
          uVar5 = *(uint *)(pcVar26 + -1);
          uVar9 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                         uVar5 << 0x18);
          pcVar22 = local_22f + lVar8 + -4;
          break;
        case (code)0xcf:
          uVar9 = *(ulong *)(pcVar26 + -1);
          uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                  (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                  (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                  | uVar9 << 0x38;
          pcVar22 = local_22f + lVar8;
          break;
        default:
          if (-1 < (char)cVar1) {
            pcVar22 = local_237 + lVar8;
            break;
          }
LAB_00130db7:
          pcStack_270 = (code *)0x130dbc;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_00130dbc;
        }
        if (uVar9 != num1) {
LAB_00130e0e:
          pcStack_270 = test_read_num<double,int,int(*)(char_const**,double*)>;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          pcStack_280 = 
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
          iVar4 = (int)num1;
          builtin_strncpy(acStack_3a0,"typed read of ",0xf);
          pcStack_4d0 = (code *)(long)iVar4;
          if (iVar4 < 0) {
            pcVar17 = "%lld";
            pcVar13 = pcStack_4d0;
          }
          else {
            pcVar17 = "%llu";
            pcVar13 = (code *)(num1 & 0xffffffff);
          }
          pcStack_4d8 = (code *)0x130e95;
          pcStack_4a8 = (code *)pcVar22;
          pcStack_298 = pcVar18;
          pcStack_290 = pcVar26;
          pcStack_288 = unaff_R13;
          pcStack_278 = &local_238 + lVar8;
          pcStack_270 = (code *)uVar20;
          iVar6 = snprintf(acStack_3a0 + 0xe,0xf2,pcVar17,pcVar13);
          pcVar22 = acStack_3a0 + 0xe + iVar6;
          iVar7 = 0;
          pcStack_4d8 = (code *)0x130eb4;
          iVar6 = snprintf(pcVar22,(size_t)(auStack_2a0 + -(long)pcVar22)," into ");
          __maxlen_00 = auStack_2a0 + -(long)(pcVar22 + iVar6);
          pcStack_4d8 = (code *)0x130ece;
          snprintf(pcVar22 + iVar6,(size_t)__maxlen_00,"double");
          pcStack_4d8 = (code *)0x130edd;
          _space((FILE *)_stdout);
          pcStack_4d8 = (code *)0x130ef6;
          fwrite("# ",2,1,_stdout);
          pcStack_4d8 = (code *)0x130f06;
          fputs(acStack_3a0,_stdout);
          pcStack_4d8 = (code *)0x130f13;
          fputc(10,_stdout);
          if (-1 < iVar4) {
            pcStack_4d8 = (code *)0x130f24;
            iVar7 = test_encode_uint_all_sizes
                              ((char (*) [16])&bStack_4a0,(uint64_t)(num1 & 0xffffffff));
          }
          pcVar17 = (char *)(&bStack_4a0 + (long)iVar7 * 0x10);
          pcStack_4d8 = (code *)0x130f42;
          pcVar22 = (char *)pcStack_4d0;
          iVar6 = test_encode_int_all_sizes((char (*) [16])pcVar17,(int64_t)pcStack_4d0);
          uVar5 = iVar7 + iVar6;
          if (uVar5 == 0 || SCARRY4(iVar7,iVar6) != (int)uVar5 < 0) {
            return;
          }
          fStack_4c4 = (float)iVar4;
          dStack_4c0 = (double)iVar4;
          uVar20 = (ulong)uVar5;
          puVar27 = (undefined8 *)(auStack_49f + 1);
          pcVar21 = 
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
          lVar8 = 0;
          goto LAB_00130f73;
        }
      }
      else {
        if (mVar3 == MP_FLOAT) {
          if (cVar1 != (code)0xca) {
LAB_00130de5:
            pcStack_270 = (code *)0x130e04;
            __assert_fail("c == 0xca",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x97e,"float mp_decode_float(const char **)");
          }
          uVar5 = *(uint *)(pcVar26 + -1);
          fVar12 = (float)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                          uVar5 << 0x18);
          if ((fVar12 == local_260) && (!NAN(fVar12) && !NAN(local_260))) {
            pcVar22 = (char *)(pcVar26 + 3);
            goto LAB_00130bdc;
          }
          pcStack_270 = (code *)0x130e09;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130e09:
          pcStack_270 = (code *)0x130e0e;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_00130e0e;
        }
        if (mVar3 == MP_INT) {
          switch(cVar1) {
          case (code)0xd0:
            uVar9 = (ulong)(char)pcVar26[-1];
            pcVar22 = (char *)pcVar26;
            break;
          case (code)0xd1:
            uVar9 = (ulong)(short)(*(ushort *)(pcVar26 + -1) << 8 | *(ushort *)(pcVar26 + -1) >> 8);
            pcVar22 = local_237 + lVar8 + 2;
            break;
          case (code)0xd2:
            uVar5 = *(uint *)(pcVar26 + -1);
            uVar9 = (ulong)(int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                                uVar5 << 0x18);
            pcVar22 = local_22f + lVar8 + -4;
            break;
          case (code)0xd3:
            uVar9 = *(ulong *)(pcVar26 + -1);
            uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                    (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                    (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                    (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
            pcVar22 = local_22f + lVar8;
            break;
          default:
            if ((byte)cVar1 < 0xe0) {
              pcStack_270 = (code *)0x130db7;
              test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
              goto LAB_00130db7;
            }
            uVar9 = uVar24;
            pcVar22 = local_237 + lVar8;
          }
          if (uVar9 != num1) goto LAB_00130e09;
        }
        else {
          if (cVar1 != (code)0xcb) goto LAB_00130dc1;
          uVar9 = *(ulong *)(pcVar26 + -1);
          dVar16 = (double)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                            (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                            (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                            (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
          if ((dVar16 != local_248) || (NAN(dVar16) || NAN(local_248))) {
            pcStack_270 = (code *)0x130de5;
            test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
            goto LAB_00130de5;
          }
          pcVar22 = local_22f + lVar8;
        }
      }
LAB_00130bdc:
      unaff_R13 = pcVar26 + -2;
      switch(cVar1) {
      case (code)0xcc:
        uVar24 = (ulong)(byte)pcVar26[-1];
        goto LAB_00130c11;
      case (code)0xcd:
        pcVar13 = (code *)(local_237 + lVar8 + 2);
        uVar24 = (ulong)(ushort)(*(ushort *)(pcVar26 + -1) << 8 | *(ushort *)(pcVar26 + -1) >> 8);
        break;
      case (code)0xce:
        uVar5 = *(uint *)(pcVar26 + -1);
        uVar24 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                        uVar5 << 0x18);
        pcVar13 = (code *)(local_22f + lVar8 + -4);
        break;
      case (code)0xcf:
        uVar9 = *(ulong *)(pcVar26 + -1);
        uVar24 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                 (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                 (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
                 uVar9 << 0x38;
        if (-1 < (long)uVar24) goto LAB_00130c3f;
LAB_00130d8e:
        uVar24 = 0;
        iVar6 = 1;
        iVar4 = 0;
        pcVar13 = unaff_R13;
        goto LAB_00130c91;
      case (code)0xd0:
        uVar24 = (ulong)(char)pcVar26[-1];
LAB_00130c11:
        pcVar13 = (code *)(local_237 + lVar8 + 1);
        break;
      case (code)0xd1:
        pcVar13 = (code *)(local_237 + lVar8 + 2);
        uVar24 = (ulong)(short)(*(ushort *)(pcVar26 + -1) << 8 | *(ushort *)(pcVar26 + -1) >> 8);
        break;
      case (code)0xd2:
        uVar5 = *(uint *)(pcVar26 + -1);
        pcVar13 = (code *)(local_22f + lVar8 + -4);
        uVar24 = (ulong)(int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                             uVar5 << 0x18);
        break;
      case (code)0xd3:
        uVar9 = *(ulong *)(pcVar26 + -1);
        uVar24 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                 (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                 (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
                 uVar9 << 0x38;
LAB_00130c3f:
        pcVar13 = (code *)(local_22f + lVar8);
        break;
      default:
        if ((char)cVar1 < -0x20) goto LAB_00130d8e;
        pcVar13 = (code *)(local_237 + lVar8);
      }
      iVar4 = 1;
      iVar6 = 0;
LAB_00130c91:
      if ((char)local_25c == '\0') {
        pcStack_270 = (code *)0x130d51;
        _ok(iVar6,"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)cVar1);
        pcVar22 = "mp_num_pos2 == mp_nums[i]";
        pcStack_270 = (code *)0x130d77;
        _ok((uint)(unaff_R13 == pcVar13),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
        num1 = local_258;
      }
      else {
        pcStack_270 = (code *)0x130ccd;
        local_250 = pcVar26;
        _ok(iVar4,"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)cVar1);
        pcStack_270 = (code *)0x130cf3;
        _ok((uint)((code *)pcVar22 == pcVar13),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        num1 = local_258;
        if ((long)uVar24 < 0) {
LAB_00130dbc:
          pcStack_270 = (code *)0x130dc1;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130dc1:
          pcStack_270 = (code *)0x130de0;
          __assert_fail("c == 0xcb",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x987,"double mp_decode_double(const char **)");
        }
        pcVar22 = "(uint64_t)num1 == (uint64_t)num2";
        pcStack_270 = (code *)0x130d27;
        _ok((uint)(uVar24 == local_258),"(uint64_t)num1 == (uint64_t)num2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x743,"check int number");
        pcVar26 = local_250;
        unaff_R13 = pcVar18;
      }
      pcVar18 = pcVar18 + 1;
      pcVar26 = pcVar26 + 0x10;
      uVar20 = uVar20 - 1;
    } while (uVar20 != 0);
  }
  return;
LAB_00130f73:
  lVar10 = lVar8 * 0x10;
  bVar2 = *(byte *)((long)puVar27 + -2);
  pcVar26 = (code *)(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pcVar26];
  puVar19 = puVar27;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pcVar26 = (code *)(ulong)*(byte *)((long)puVar27 + -1);
      break;
    case 0xcd:
      pcVar26 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar27 + -1) << 8 |
                                       *(ushort *)((long)puVar27 + -1) >> 8);
      puVar19 = (undefined8 *)((long)auStack_497 + lVar10 + -6);
      break;
    case 0xce:
      uVar5 = *(uint *)((long)puVar27 + -1);
      pcVar26 = (code *)(ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                               uVar5 << 0x18);
      puVar19 = (undefined8 *)((long)auStack_497 + lVar10 + -4);
      break;
    case 0xcf:
      uVar9 = *(ulong *)((long)puVar27 + -1);
      pcVar26 = (code *)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                         (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                         (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
      puVar19 = auStack_497 + lVar8 * 2;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_001311cd:
        pcStack_4d8 = (code *)0x1311d2;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d2:
        pcStack_4d8 = (code *)0x1311d7;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d7:
        pcStack_4d8 = (code *)0x1311f6;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar19 = auStack_497 + lVar8 * 2 + -1;
    }
    if (pcVar26 != pcStack_4d0) {
      pcStack_4d8 = (code *)0x13121f;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_0013121f:
      pcStack_4d8 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_4d8 = (code *)0x139f88;
      builtin_strncpy(acStack_608,"typed read of ",0xf);
      pcStack_740 = (code *)0x13128b;
      uStack_724 = extraout_EDX;
      pcStack_710 = (code *)pcVar22;
      puStack_500 = puVar19;
      uStack_4f8 = uVar20;
      puStack_4f0 = puVar27;
      lStack_4e8 = lVar8;
      puStack_4e0 = __maxlen_00;
      iVar4 = snprintf(acStack_608 + 0xe,0xf2,"%llu",pcVar17);
      pcVar22 = acStack_608 + (long)iVar4 + 0xe;
      pcStack_740 = (code *)0x1312af;
      iVar4 = snprintf(pcVar22,(size_t)(auStack_508 + -(long)pcVar22)," into ");
      pcStack_740 = (code *)0x1312c9;
      snprintf(pcVar22 + iVar4,(size_t)(auStack_508 + -(long)(pcVar22 + iVar4)),"double");
      pcStack_740 = (code *)0x1312d8;
      _space((FILE *)_stdout);
      pcStack_740 = (code *)0x1312f1;
      fwrite("# ",2,1,_stdout);
      pcStack_740 = (code *)0x131301;
      fputs(acStack_608,_stdout);
      pcStack_740 = (code *)0x13130e;
      fputc(10,_stdout);
      pcStack_740 = (code *)0x13131b;
      iVar4 = test_encode_uint_all_sizes((char (*) [16])&bStack_708,(uint64_t)pcVar17);
      pacVar15 = (char (*) [16])(&bStack_708 + (long)iVar4 * 0x10);
      pcStack_740 = (code *)0x131339;
      pacStack_738 = (char (*) [16])pcVar17;
      iVar6 = test_encode_int_all_sizes(pacVar15,(int64_t)pcVar17);
      uVar5 = iVar4 + iVar6;
      if (uVar5 == 0 || SCARRY4(iVar4,iVar6) != (int)uVar5 < 0) {
        return;
      }
      fStack_728 = (float)(long)pacStack_738;
      dStack_720 = (double)(long)pacStack_738;
      uVar20 = (ulong)uVar5;
      pcVar23 = (char *)((long)&uStack_707 + 1);
      lVar8 = 0;
      goto LAB_00131368;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_001311fb:
      pcStack_4d8 = (code *)0x13121a;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar5 = *(uint *)((long)puVar27 + -1);
    fVar12 = (float)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
                    );
    if ((fVar12 != fStack_4c4) || (NAN(fVar12) || NAN(fStack_4c4))) goto LAB_001311d2;
    puVar19 = (undefined8 *)((long)puVar27 + 3);
  }
  else if (mVar3 == MP_INT) {
    pcVar26 = (code *)(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pcVar26 = (code *)(long)*(char *)((long)puVar27 + -1);
      pcVar22 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd1:
      pcVar26 = (code *)(long)(short)(*(ushort *)((long)puVar27 + -1) << 8 |
                                     *(ushort *)((long)puVar27 + -1) >> 8);
      puVar19 = (undefined8 *)((long)auStack_497 + lVar10 + -6);
      pcVar22 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd2:
      uVar5 = *(uint *)((long)puVar27 + -1);
      pcVar26 = (code *)(long)(int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8
                                   | uVar5 << 0x18);
      puVar19 = (undefined8 *)((long)auStack_497 + lVar10 + -4);
      pcVar22 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd3:
      uVar9 = *(ulong *)((long)puVar27 + -1);
      pcVar26 = (code *)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                         (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                         (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
      puVar19 = auStack_497 + lVar8 * 2;
      pcVar22 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_4d8 = (code *)0x1311cd;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001311cd;
      }
      puVar19 = auStack_497 + lVar8 * 2 + -1;
    }
    if (pcVar26 != pcStack_4d0) goto LAB_0013121f;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_001311d7;
    uVar9 = *(ulong *)((long)puVar27 + -1);
    dVar16 = (double)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
    if ((dVar16 != dStack_4c0) || (NAN(dVar16) || NAN(dStack_4c0))) {
      pcStack_4d8 = (code *)0x1311fb;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_001311fb;
    }
    puVar19 = auStack_497 + lVar8 * 2;
  }
  puStack_4b0 = (undefined8 *)((long)puVar27 + -2);
  __maxlen_00 = (undefined1 *)(ulong)(uint)(int)(char)bVar2;
  dStack_4b8 = 0.0;
  pcStack_4d8 = (code *)0x131113;
  iVar4 = (*pcStack_4a8)(&puStack_4b0,&dStack_4b8);
  pcStack_4d8 = (code *)0x13113b;
  _ok((uint)(iVar4 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",__maxlen_00);
  pcStack_4d8 = (code *)0x131163;
  _ok((uint)(puVar19 == puStack_4b0),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar28 = ABS(dStack_4c0 - dStack_4b8) < 1e-15;
  pcVar17 = (char *)(ulong)bVar28;
  pcVar22 = "double_eq(num1, num2)";
  pcStack_4d8 = (code *)0x1311a6;
  _ok((uint)bVar28,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar8 = lVar8 + 1;
  puVar27 = puVar27 + 2;
  uVar20 = uVar20 - 1;
  if (uVar20 == 0) {
    return;
  }
  goto LAB_00130f73;
LAB_00131368:
  lVar10 = lVar8 * 0x10;
  bVar2 = pcVar23[-2];
  pacVar14 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar14];
  pcVar25 = pcVar23;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar14 = (char (*) [16])(ulong)(byte)pcVar23[-1];
      break;
    case 0xcd:
      pacVar14 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar23 + -1) << 8 | *(ushort *)(pcVar23 + -1) >> 8);
      pcVar25 = acStack_6ff + lVar10 + -6;
      break;
    case 0xce:
      uVar5 = *(uint *)(pcVar23 + -1);
      pacVar14 = (char (*) [16])
                 (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                        uVar5 << 0x18);
      pcVar25 = acStack_6ff + lVar10 + -4;
      break;
    case 0xcf:
      uVar9 = *(ulong *)(pcVar23 + -1);
      pacVar14 = (char (*) [16])
                 (uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                  (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                  (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                 | uVar9 << 0x38);
      pcVar25 = acStack_6ff + lVar8 * 0x10;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131627:
        pcStack_740 = (code *)0x13162c;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_0013162c:
        pcStack_740 = (code *)0x131631;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131631:
        pcStack_740 = (code *)0x131650;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar25 = acStack_6ff + (lVar8 * 2 + -1) * 8;
    }
    if (pacVar14 != pacStack_738) {
      pcStack_740 = (code *)0x131679;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131679:
      pcStack_740 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_970,"typed read of ",0xf);
      pcStack_9a8 = (code *)0x1316e2;
      uStack_98c = extraout_EDX_00;
      pacStack_978 = (char (*) [16])pcVar17;
      lStack_768 = lVar8;
      uStack_760 = uVar20;
      pcStack_758 = pcVar22;
      pcStack_750 = pcVar25;
      pcStack_748 = pcVar23;
      pcStack_740 = (code *)pcVar21;
      iVar4 = snprintf(acStack_970 + 0xe,0xf2,"%lld",pacVar15);
      pcVar22 = acStack_970 + (long)iVar4 + 0xe;
      pcStack_9a8 = (code *)0x131703;
      iVar4 = snprintf(pcVar22,(size_t)(&bStack_870 + -(long)pcVar22)," into ");
      pcStack_9a8 = (code *)0x13171d;
      snprintf(pcVar22 + iVar4,(size_t)(&bStack_870 + -(long)(pcVar22 + iVar4)),"double");
      pcStack_9a8 = (code *)0x13172c;
      _space((FILE *)_stdout);
      pcStack_9a8 = (code *)0x131745;
      fwrite("# ",2,1,_stdout);
      pcStack_9a8 = (code *)0x131752;
      fputs(acStack_970,_stdout);
      pcStack_9a8 = (code *)0x13175f;
      fputc(10,_stdout);
      pacVar14 = (char (*) [16])&bStack_870;
      pcStack_9a8 = (code *)0x131773;
      pacStack_9a0 = pacVar15;
      uVar5 = test_encode_int_all_sizes(pacVar14,(int64_t)pacVar15);
      if ((int)uVar5 < 1) {
        return;
      }
      fStack_990 = (float)(long)pacStack_9a0;
      dStack_988 = (double)(long)pacStack_9a0;
      uVar20 = (ulong)uVar5;
      pcVar17 = (char *)((long)&uStack_86f + 1);
      lVar8 = 0;
      goto LAB_001317a5;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131655:
      pcStack_740 = (code *)0x131674;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar5 = *(uint *)(pcVar23 + -1);
    fVar12 = (float)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
                    );
    if ((fVar12 != fStack_728) || (NAN(fVar12) || NAN(fStack_728))) goto LAB_0013162c;
    pcVar25 = pcVar23 + 3;
  }
  else if (mVar3 == MP_INT) {
    pacVar14 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar14 = (char (*) [16])(long)pcVar23[-1];
      pcVar17 = (char *)&switchD_001313bd::switchdataD_00139bac;
      break;
    case 0xd1:
      pacVar14 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar23 + -1) << 8 | *(ushort *)(pcVar23 + -1) >> 8);
      pcVar17 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar25 = acStack_6ff + lVar10 + -6;
      break;
    case 0xd2:
      uVar5 = *(uint *)(pcVar23 + -1);
      pacVar14 = (char (*) [16])
                 (long)(int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                            uVar5 << 0x18);
      pcVar17 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar25 = acStack_6ff + lVar10 + -4;
      break;
    case 0xd3:
      uVar9 = *(ulong *)(pcVar23 + -1);
      pacVar14 = (char (*) [16])
                 (uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                  (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                  (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                 | uVar9 << 0x38);
      pcVar17 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar25 = acStack_6ff + lVar8 * 0x10;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_740 = (code *)0x131627;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00131627;
      }
      pcVar25 = acStack_6ff + (lVar8 * 2 + -1) * 8;
    }
    if (pacVar14 != pacStack_738) goto LAB_00131679;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131631;
    uVar9 = *(ulong *)(pcVar23 + -1);
    dVar16 = (double)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
    if ((dVar16 != dStack_720) || (NAN(dVar16) || NAN(dStack_720))) {
      pcStack_740 = (code *)0x131655;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00131655;
    }
    pcVar25 = acStack_6ff + lVar8 * 0x10;
  }
  pcVar21 = pcVar23 + -2;
  pcVar22 = (char *)(ulong)(uint)(int)(char)bVar2;
  dStack_718 = 0.0;
  pcStack_740 = (code *)0x131508;
  pcStack_730 = pcVar21;
  iVar4 = (*pcStack_710)(&pcStack_730,&dStack_718);
  if ((char)uStack_724 == '\0') {
    pcStack_740 = (code *)0x1315d8;
    _ok((uint)(iVar4 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar22);
    bVar28 = pcVar21 == pcStack_730;
    pcVar17 = "mp_num_pos2 == mp_nums[i]";
    iVar4 = 0x738;
    pcVar25 = "check position";
  }
  else {
    pcVar21 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_740 = (code *)0x131542;
    _ok((uint)(iVar4 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar22);
    pcStack_740 = (code *)0x13156a;
    _ok((uint)(pcVar25 == pcStack_730),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar28 = ABS(dStack_720 - dStack_718) < 1e-15;
    pcVar17 = "double_eq(num1, num2)";
    iVar4 = 0x73e;
    pcVar25 = "check float number";
  }
  pacVar15 = (char (*) [16])(ulong)bVar28;
  pcStack_740 = (code *)0x131600;
  _ok((uint)bVar28,pcVar17,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      pcVar25);
  lVar8 = lVar8 + 1;
  pcVar23 = pcVar23 + 0x10;
  uVar20 = uVar20 - 1;
  if (uVar20 == 0) {
    return;
  }
  goto LAB_00131368;
LAB_001317a5:
  lVar10 = lVar8 * 0x10;
  bVar2 = pcVar17[-2];
  pacVar15 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar15];
  pcVar23 = pcVar17;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar15 = (char (*) [16])(ulong)(byte)pcVar17[-1];
      break;
    case 0xcd:
      pacVar15 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
      pcVar23 = acStack_867 + lVar10 + -6;
      break;
    case 0xce:
      uVar5 = *(uint *)(pcVar17 + -1);
      pacVar15 = (char (*) [16])
                 (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                        uVar5 << 0x18);
      pcVar23 = acStack_867 + lVar10 + -4;
      break;
    case 0xcf:
      uVar9 = *(ulong *)(pcVar17 + -1);
      pacVar15 = (char (*) [16])
                 (uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                  (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                  (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                 | uVar9 << 0x38);
      pcVar23 = acStack_867 + lVar8 * 0x10;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131a67:
        pcStack_9a8 = (code *)0x131a6c;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a6c:
        pcStack_9a8 = (code *)0x131a71;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a71:
        pcStack_9a8 = (code *)0x131a90;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar23 = acStack_867 + (lVar8 * 2 + -1) * 8;
    }
    if (pacVar15 != pacStack_9a0) {
      pcStack_9a8 = (code *)0x131ab9;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131ab9:
      pcStack_9a8 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_bd8,"typed read of ",0xf);
      pcStack_c00 = (code *)0x131b1e;
      pacStack_be0 = pacVar14;
      lStack_9d0 = lVar8;
      uStack_9c8 = uVar20;
      pcStack_9c0 = pcVar22;
      pcStack_9b8 = pcVar23;
      pcStack_9b0 = pcVar17;
      pcStack_9a8 = (code *)pcVar21;
      iVar4 = snprintf(acStack_bd8 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar22 = acStack_bd8 + (long)iVar4 + 0xe;
      pcStack_c00 = (code *)0x131b3f;
      iVar4 = snprintf(pcVar22,(size_t)(&bStack_ad8 + -(long)pcVar22)," into ");
      __maxlen = &bStack_ad8 + -(long)(pcVar22 + iVar4);
      pcStack_c00 = (code *)0x131b59;
      snprintf(pcVar22 + iVar4,(size_t)__maxlen,"double");
      pcStack_c00 = (code *)0x131b68;
      _space((FILE *)_stdout);
      lVar10 = 1;
      pcStack_c00 = (code *)0x131b87;
      fwrite("# ",2,1,_stdout);
      pcStack_c00 = (code *)0x131b94;
      fputs(acStack_bd8,_stdout);
      pcVar26 = (code *)0xa;
      pcStack_c00 = (code *)0x131ba1;
      fputc(10,_stdout);
      puVar27 = (undefined8 *)(auStack_ad7 + 1);
      bStack_ad8 = 0xca;
      _auStack_ad7 = 0x1059c84a;
      uStack_acf._7_1_ = 0xcb;
      uStack_ac7 = 0x220b5941;
      lVar8 = 0;
      goto LAB_00131bd0;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131a95:
      pcStack_9a8 = (code *)0x131ab4;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar5 = *(uint *)(pcVar17 + -1);
    fVar12 = (float)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
                    );
    if ((fVar12 != fStack_990) || (NAN(fVar12) || NAN(fStack_990))) goto LAB_00131a6c;
    pcVar23 = pcVar17 + 3;
  }
  else if (mVar3 == MP_INT) {
    pacVar15 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar15 = (char (*) [16])(long)pcVar17[-1];
      break;
    case 0xd1:
      pacVar15 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
      pcVar23 = acStack_867 + lVar10 + -6;
      break;
    case 0xd2:
      uVar5 = *(uint *)(pcVar17 + -1);
      pacVar15 = (char (*) [16])
                 (long)(int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                            uVar5 << 0x18);
      pcVar23 = acStack_867 + lVar10 + -4;
      break;
    case 0xd3:
      uVar9 = *(ulong *)(pcVar17 + -1);
      pacVar15 = (char (*) [16])
                 (uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                  (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                  (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                 | uVar9 << 0x38);
      pcVar23 = acStack_867 + lVar8 * 0x10;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_9a8 = (code *)0x131a67;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00131a67;
      }
      pcVar23 = acStack_867 + (lVar8 * 2 + -1) * 8;
    }
    if (pacVar15 != pacStack_9a0) goto LAB_00131ab9;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131a71;
    uVar9 = *(ulong *)(pcVar17 + -1);
    dVar16 = (double)(uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
    if ((dVar16 != dStack_988) || (NAN(dVar16) || NAN(dStack_988))) {
      pcStack_9a8 = (code *)0x131a95;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_00131a95;
    }
    pcVar23 = acStack_867 + lVar8 * 0x10;
  }
  pcVar21 = pcVar17 + -2;
  pcVar22 = (char *)(ulong)(uint)(int)(char)bVar2;
  dStack_980 = 0.0;
  pcStack_9a8 = (code *)0x131948;
  pcStack_998 = pcVar21;
  iVar4 = (*(code *)pacStack_978)(&pcStack_998,&dStack_980);
  if ((char)uStack_98c == '\0') {
    pcStack_9a8 = (code *)0x131a18;
    _ok((uint)(iVar4 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar22);
    bVar28 = pcVar21 == pcStack_998;
    pcVar23 = "mp_num_pos2 == mp_nums[i]";
    iVar4 = 0x738;
    pcVar25 = "check position";
  }
  else {
    pcVar21 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_9a8 = (code *)0x131982;
    _ok((uint)(iVar4 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar22);
    pcStack_9a8 = (code *)0x1319aa;
    _ok((uint)(pcVar23 == pcStack_998),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar28 = ABS(dStack_988 - dStack_980) < 1e-15;
    pcVar23 = "double_eq(num1, num2)";
    iVar4 = 0x73e;
    pcVar25 = "check float number";
  }
  pacVar14 = (char (*) [16])(ulong)bVar28;
  pcStack_9a8 = (code *)0x131a40;
  _ok((uint)bVar28,pcVar23,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      pcVar25);
  lVar8 = lVar8 + 1;
  pcVar17 = pcVar17 + 0x10;
  uVar20 = uVar20 - 1;
  if (uVar20 == 0) {
    return;
  }
  goto LAB_001317a5;
LAB_00131bd0:
  lVar11 = lVar8 * 0x10;
  bVar2 = *(byte *)((long)puVar27 + -2);
  uVar20 = (ulong)bVar2;
  mVar3 = mp_type_hint[uVar20];
  puVar19 = puVar27;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      uVar20 = (ulong)*(byte *)((long)puVar27 + -1);
      break;
    case 0xcd:
      uVar20 = (ulong)(ushort)(*(ushort *)((long)puVar27 + -1) << 8 |
                              *(ushort *)((long)puVar27 + -1) >> 8);
      puVar19 = (undefined8 *)(auStack_ad5 + lVar11);
      break;
    case 0xce:
      uVar5 = *(uint *)((long)puVar27 + -1);
      uVar20 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                      uVar5 << 0x18);
      puVar19 = (undefined8 *)(auStack_ad5 + lVar11 + 2);
      break;
    case 0xcf:
      uVar20 = *(ulong *)((long)puVar27 + -1);
      uVar20 = uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
               (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
               (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28
               | uVar20 << 0x38;
      puVar19 = &uStack_acf + lVar8 * 2;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131e46:
        pcStack_c00 = (code *)0x131e4b;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e4b:
        pcStack_c00 = (code *)0x131e50;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e50:
        pcStack_c00 = (code *)0x131e6f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar19 = (undefined8 *)(auStack_ad7 + lVar11);
    }
    if (uVar20 != 0x642c88) {
      pcStack_c00 = (code *)0x131e98;
      test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e98:
      pcStack_c00 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_e10,"typed read of ",0xf);
      puStack_c10 = puVar19;
      pbStack_c08 = __maxlen;
      pcStack_c00 = (code *)lVar10;
      iVar4 = snprintf(acStack_e10 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar22 = acStack_e10 + (long)iVar4 + 0xe;
      iVar4 = snprintf(pcVar22,(size_t)(&uStack_d10 + -(long)pcVar22)," into ");
      snprintf(pcVar22 + iVar4,(size_t)(&uStack_d10 + -(long)(pcVar22 + iVar4)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_e10,_stdout);
      fputc(10,_stdout);
      uStack_d10 = 0xcb;
      uStack_d0f = 0xb81e85eb513816c0;
      puStack_e18 = &uStack_d10;
      dStack_e20 = 0.0;
      iVar4 = (*pcVar26)(&puStack_e18,&dStack_e20);
      _ok((uint)(iVar4 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_d07 == puStack_e18),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_e20) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131e74:
      pcStack_c00 = (code *)0x131e93;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar5 = *(uint *)((long)puVar27 + -1);
    fVar12 = (float)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
                    );
    if ((fVar12 != 6.565e+06) || (NAN(fVar12))) goto LAB_00131e4b;
    puVar19 = (undefined8 *)((long)puVar27 + 3);
  }
  else if (mVar3 == MP_INT) {
    uVar20 = (ulong)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      uVar20 = (ulong)*(char *)((long)puVar27 + -1);
      break;
    case 0xd1:
      uVar20 = (ulong)(short)(*(ushort *)((long)puVar27 + -1) << 8 |
                             *(ushort *)((long)puVar27 + -1) >> 8);
      puVar19 = (undefined8 *)(auStack_ad5 + lVar11);
      break;
    case 0xd2:
      uVar5 = *(uint *)((long)puVar27 + -1);
      uVar20 = (ulong)(int)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                           uVar5 << 0x18);
      puVar19 = (undefined8 *)(auStack_ad5 + lVar11 + 2);
      break;
    case 0xd3:
      uVar20 = *(ulong *)((long)puVar27 + -1);
      uVar20 = uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
               (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
               (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28
               | uVar20 << 0x38;
      puVar19 = &uStack_acf + lVar8 * 2;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_c00 = (code *)0x131e46;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00131e46;
      }
      puVar19 = (undefined8 *)(auStack_ad7 + lVar11);
    }
    if (uVar20 != 0x642c88) goto LAB_00131e98;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131e50;
    uVar20 = *(ulong *)((long)puVar27 + -1);
    dVar16 = (double)(uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                      (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                      (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                      (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38);
    if ((dVar16 != 6565000.0) || (NAN(dVar16))) {
      pcStack_c00 = (code *)0x131e74;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      goto LAB_00131e74;
    }
    puVar19 = &uStack_acf + lVar8 * 2;
  }
  puStack_be8 = (undefined8 *)((long)puVar27 + -2);
  __maxlen = (byte *)(ulong)(uint)(int)(char)bVar2;
  dStack_bf0 = 0.0;
  pcStack_c00 = (code *)0x131d8a;
  iVar4 = (*(code *)pacStack_be0)(&puStack_be8,&dStack_bf0);
  pcStack_c00 = (code *)0x131db2;
  _ok((uint)(iVar4 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",__maxlen);
  pcStack_c00 = (code *)0x131dda;
  _ok((uint)(puVar19 == puStack_be8),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar28 = ABS(6565000.0 - dStack_bf0) < 1e-15;
  pcVar26 = (code *)(ulong)bVar28;
  pcStack_c00 = (code *)0x131e1f;
  _ok((uint)bVar28,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar8 = lVar8 + 1;
  puVar27 = puVar27 + 2;
  lVar10 = lVar10 + -1;
  if (lVar10 != 0) {
    return;
  }
  goto LAB_00131bd0;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}